

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.cpp
# Opt level: O2

BOOL SEHInitializeSignals(void)

{
  int signal_id;
  
  if (PAL_InitializeChakraCoreCalled) {
    handle_signal(4,sigill_handler,&g_previous_sigill,0);
    handle_signal(5,sigtrap_handler,&g_previous_sigtrap,0);
    handle_signal(8,sigfpe_handler,&g_previous_sigfpe,0);
    handle_signal(7,sigbus_handler,&g_previous_sigbus,0);
    handle_signal(0xb,sigsegv_handler,&g_previous_sigsegv,0x8000000);
    signal_id = __libc_current_sigrtmin();
    handle_signal(signal_id,inject_activation_handler,(sigaction *)0x0,0);
    signal(0xd,(__sighandler_t)&DAT_00000001);
    return 1;
  }
  abort();
}

Assistant:

BOOL SEHInitializeSignals()
{
    TRACE("Initializing signal handlers\n");

    /* we call handle signal for every possible signal, even
       if we don't provide a signal handler.

       handle_signal will set SA_RESTART flag for specified signal.
       Therefore, all signals will have SA_RESTART flag set, preventing
       slow Unix system calls from being interrupted. On systems without
       siginfo_t, SIGKILL and SIGSTOP can't be restarted, so we don't
       handle those signals. Both the Darwin and FreeBSD man pages say
       that SIGKILL and SIGSTOP can't be handled, but FreeBSD allows us
       to register a handler for them anyway. We don't do that.

       see sigaction man page for more details
       */
    handle_signal(SIGILL, sigill_handler, &g_previous_sigill);
    handle_signal(SIGTRAP, sigtrap_handler, &g_previous_sigtrap);
    handle_signal(SIGFPE, sigfpe_handler, &g_previous_sigfpe);
    handle_signal(SIGBUS, sigbus_handler, &g_previous_sigbus);
    handle_signal(SIGSEGV, sigsegv_handler, &g_previous_sigsegv, SA_ONSTACK);

    handle_signal(INJECT_ACTIVATION_SIGNAL, inject_activation_handler, NULL);

    /* The default action for SIGPIPE is process termination.
       Since SIGPIPE can be signaled when trying to write on a socket for which
       the connection has been dropped, we need to tell the system we want
       to ignore this signal.

       Instead of terminating the process, the system call which would had
       issued a SIGPIPE will, instead, report an error and set errno to EPIPE.
    */
    signal(SIGPIPE, SIG_IGN);

    return TRUE;
}